

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

Optional<unsigned_long> __thiscall llvm::DWARFDebugNames::Entry::getCUIndex(Entry *this)

{
  bool bVar1;
  uint32_t uVar2;
  DWARFFormValue *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  OptionalStorage<unsigned_long,_true> OVar3;
  Optional<unsigned_long> OVar4;
  unsigned_long local_60;
  undefined1 local_58 [8];
  Optional<llvm::DWARFFormValue> Off;
  Entry *this_local;
  bool local_10;
  
  Off.Storage._48_8_ = this;
  lookup((Optional<llvm::DWARFFormValue> *)local_58,this,DW_IDX_compile_unit);
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)local_58);
  if (bVar1) {
    this_00 = Optional<llvm::DWARFFormValue>::operator->((Optional<llvm::DWARFFormValue> *)local_58)
    ;
    OVar3 = (OptionalStorage<unsigned_long,_true>)DWARFFormValue::getAsUnsignedConstant(this_00);
    local_10 = OVar3.hasVal;
  }
  else {
    uVar2 = NameIndex::getCUCount(this->NameIdx);
    if (uVar2 == 1) {
      local_60 = 0;
      Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&this_local,&local_60);
      OVar3._8_8_ = extraout_RDX;
      OVar3.field_0 = (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)this_local
      ;
    }
    else {
      Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&this_local,None);
      OVar3._8_8_ = extraout_RDX_00;
      OVar3.field_0 = (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)this_local
      ;
    }
  }
  this_local = (Entry *)OVar3.field_0;
  OVar4.Storage._9_7_ = OVar3._9_7_;
  OVar4.Storage.hasVal = local_10;
  OVar4.Storage.field_0 =
       (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)this_local;
  return (Optional<unsigned_long>)OVar4.Storage;
}

Assistant:

Optional<uint64_t> DWARFDebugNames::Entry::getCUIndex() const {
  if (Optional<DWARFFormValue> Off = lookup(dwarf::DW_IDX_compile_unit))
    return Off->getAsUnsignedConstant();
  // In a per-CU index, the entries without a DW_IDX_compile_unit attribute
  // implicitly refer to the single CU.
  if (NameIdx->getCUCount() == 1)
    return 0;
  return None;
}